

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O3

vm_obj_id_t CVmBif::str_from_ui_str(char *str,size_t len)

{
  int iVar1;
  vm_obj_id_t vVar2;
  undefined4 extraout_var;
  size_t outlen;
  size_t local_38;
  long local_30;
  
  local_38 = 0;
  iVar1 = (*(G_cmap_from_ui_X->super_CCharmap)._vptr_CCharmap[4])
                    (G_cmap_from_ui_X,0,&local_38,str,len);
  local_38 = CONCAT44(extraout_var,iVar1);
  vVar2 = CVmObjString::create(0,local_38);
  local_30 = *(long *)((long)&G_obj_table_X.pages_[vVar2 >> 0xc][vVar2 & 0xfff].ptr_ + 8) + 2;
  (*(G_cmap_from_ui_X->super_CCharmap)._vptr_CCharmap[4])
            (G_cmap_from_ui_X,&local_30,&local_38,str,len);
  return vVar2;
}

Assistant:

vm_obj_id_t CVmBif::str_from_ui_str(VMG_ const char *str, size_t len)
{
    /* figure out how much space we need */
    char *outp = 0;
    size_t outlen = 0;
    outlen = G_cmap_from_ui->map(0, &outlen, str, len);

    /* allocate a string of that size */
    vm_obj_id_t str_id = CVmObjString::create(vmg_ FALSE, outlen);
    CVmObjString *str_obj = (CVmObjString *)vm_objp(vmg_ str_id);

    /* map the string into the new string buffer */
    outp = str_obj->cons_get_buf();
    G_cmap_from_ui->map(&outp, &outlen, str, len);

    /* return the new string object */
    return str_id;
}